

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

void __thiscall rcg::Stream::startStreaming(Stream *this,int nacquire,int min_buffers)

{
  bool bVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  GC_ERROR GVar5;
  long lVar6;
  long *plVar7;
  size_t sVar8;
  size_t sVar9;
  ICommand *pIVar10;
  GenTLException *pGVar11;
  uint64_t uVar12;
  ulong uVar13;
  undefined8 *puVar14;
  shared_ptr<GenApi_3_4::CNodeMapRef> nmap;
  BUFFER_HANDLE pp;
  CCommandPtr start;
  undefined1 local_b0 [16];
  undefined1 local_a0 [80];
  CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> local_50;
  undefined8 local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar4 == 0) {
    Buffer::setHandle(&this->buffer,(void *)0x0);
    if (this->stream != (void *)0x0) {
      if (this->bn != 0) {
        stopStreaming(this);
      }
      Device::getRemoteNodeMap
                ((Device *)local_b0,
                 (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      uVar2 = local_b0._0_8_;
      GenICam_3_4::gcstring::gcstring((gcstring *)local_a0,"TLParamsLocked");
      lVar6 = (*(code *)(((((enable_shared_from_this<rcg::Device> *)uVar2)->_M_weak_this).
                          super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id).
                        _M_string_length)(uVar2,local_a0);
      if (lVar6 == 0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)__dynamic_cast(lVar6,&GenApi_3_4::INode::typeinfo,
                                        &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
      }
      GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
      if (plVar7 == (long *)0x0) {
        puVar14 = (undefined8 *)0x0;
      }
      else {
        puVar14 = (undefined8 *)(*(long *)(*plVar7 + -0x28) + (long)plVar7);
      }
      if ((puVar14 != (undefined8 *)0x0) &&
         ((iVar4 = (**(code **)*puVar14)(), iVar4 == 4 || (iVar4 == 2)))) {
        (**(code **)(*plVar7 + 0x38))(plVar7,1,1);
      }
      bVar3 = getDefinesPayloadsize(this);
      uVar2 = local_b0._0_8_;
      if (bVar3) {
        sVar8 = getPayloadSize(this);
      }
      else {
        GenICam_3_4::gcstring::gcstring((gcstring *)local_a0,"PayloadSize");
        lVar6 = (*(code *)(((((enable_shared_from_this<rcg::Device> *)uVar2)->_M_weak_this).
                            super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id).
                          _M_string_length)(uVar2,local_a0);
        if (lVar6 == 0) {
          plVar7 = (long *)0x0;
        }
        else {
          plVar7 = (long *)__dynamic_cast(lVar6,&GenApi_3_4::INode::typeinfo,
                                          &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
        }
        GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
        if (plVar7 == (long *)0x0) {
          puVar14 = (undefined8 *)0x0;
        }
        else {
          puVar14 = (undefined8 *)(*(long *)(*plVar7 + -0x28) + (long)plVar7);
        }
        if ((puVar14 == (undefined8 *)0x0) || (iVar4 = (**(code **)*puVar14)(), 1 < iVar4 - 3U)) {
          sVar8 = 0;
        }
        else {
          sVar8 = (**(code **)(*plVar7 + 0x48))(plVar7,0,0);
        }
      }
      sVar9 = getBufAnnounceMin(this);
      uVar13 = (long)min_buffers;
      if ((ulong)(long)min_buffers < sVar9) {
        uVar13 = sVar9;
      }
      this->bn = uVar13;
      if (uVar13 == 0) {
        bVar3 = false;
      }
      else {
        uVar13 = 0;
        bVar3 = false;
        do {
          local_a0._0_8_ = (element_type *)0x0;
          GVar5 = (*((this->gentl).
                     super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->DSAllocAndAnnounceBuffer)
                            (this->stream,sVar8,(void *)0x0,(BUFFER_HANDLE *)local_a0);
          if ((GVar5 == 0) &&
             ((bVar3 || (GVar5 = (*((this->gentl).
                                    super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->DSQueueBuffer)
                                           (this->stream,(BUFFER_HANDLE)local_a0._0_8_), GVar5 == 0)
              ))) {
            bVar1 = true;
          }
          else {
            bVar1 = false;
            bVar3 = true;
          }
        } while ((bVar1) && (uVar13 = uVar13 + 1, uVar13 < this->bn));
      }
      if (!bVar3) {
        GVar5 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  GCRegisterEvent)(this->stream,1,&this->event);
        bVar3 = GVar5 != 0;
      }
      if (!bVar3) {
        uVar12 = 0xffffffffffffffff;
        if (0 < nacquire) {
          uVar12 = (ulong)(uint)nacquire;
        }
        GVar5 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSStartAcquisition)(this->stream,0,uVar12);
        if (GVar5 != 0) {
          bVar3 = true;
          (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->GCUnregisterEvent)(this->stream,1);
        }
      }
      if (!bVar3) {
        Device::getRemoteNodeMap
                  ((Device *)&stack0xffffffffffffffc0,
                   (char *)(this->parent).
                           super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        GenICam_3_4::gcstring::gcstring((gcstring *)local_a0,"AcquisitionStart");
        plVar7 = (long *)(*(code *)((__pthread_internal_list *)local_40)->__prev[3].__next)
                                   (local_40,local_a0);
        if (plVar7 == (long *)0x0) {
          lVar6 = 0;
        }
        else {
          lVar6 = (long)plVar7 + *(long *)(*plVar7 + -0x28);
        }
        local_50._vptr_CPointer = (_func_int **)&PTR__CPointer_0012e6c8;
        if (lVar6 == 0) {
          local_50.m_pT = (ICommand *)0x0;
        }
        else {
          local_50.m_pT =
               (ICommand *)
               __dynamic_cast(lVar6,&GenApi_3_4::IBase::typeinfo,&GenApi_3_4::ICommand::typeinfo,
                              0xffffffffffffffff);
        }
        GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        }
        pIVar10 = GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::operator->
                            (&local_50);
        (**(code **)(*(long *)pIVar10 + 0x38))(pIVar10,1);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
        return;
      }
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSFlushQueue)(this->stream,4);
      local_50._vptr_CPointer = (_func_int **)0x0;
      while (GVar5 = (*((this->gentl).
                        super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->DSGetBufferID)(this->stream,0,&local_50._vptr_CPointer), GVar5 == 0)
      {
        (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->DSRevokeBuffer)(this->stream,local_50._vptr_CPointer,(void **)0x0,(void **)0x0);
      }
      GenICam_3_4::gcstring::gcstring((gcstring *)local_a0,"TLParamsLocked");
      lVar6 = (*(code *)(((((enable_shared_from_this<rcg::Device> *)local_b0._0_8_)->_M_weak_this).
                          super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id).
                        _M_string_length)(local_b0._0_8_,local_a0);
      if (lVar6 == 0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)__dynamic_cast(lVar6,&GenApi_3_4::INode::typeinfo,
                                        &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
      }
      GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
      if (plVar7 == (long *)0x0) {
        puVar14 = (undefined8 *)0x0;
      }
      else {
        puVar14 = (undefined8 *)(*(long *)(*plVar7 + -0x28) + (long)plVar7);
      }
      if ((puVar14 != (undefined8 *)0x0) &&
         ((iVar4 = (**(code **)*puVar14)(), iVar4 == 4 || (iVar4 == 2)))) {
        (**(code **)(*plVar7 + 0x38))(plVar7,0,1);
      }
      pGVar11 = (GenTLException *)__cxa_allocate_exception(0x28);
      local_a0._0_8_ = local_a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Stream::startStreaming()","");
      GenTLException::GenTLException(pGVar11,(string *)local_a0,&this->gentl);
      __cxa_throw(pGVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
  }
  else {
    std::__throw_system_error(iVar4);
  }
  pGVar11 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"Stream::startStreaming(): Stream is not open","");
  GenTLException::GenTLException(pGVar11,(string *)local_a0);
  __cxa_throw(pGVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void Stream::startStreaming(int nacquire, int min_buffers)
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  buffer.setHandle(0);

  if (stream == 0)
  {
    throw GenTLException("Stream::startStreaming(): Stream is not open");
  }

  // stop streaming if it is currently running

  if (bn > 0)
  {
    stopStreaming();
  }

  // lock parameters before streaming starts

  std::shared_ptr<GenApi::CNodeMapRef> nmap=parent->getRemoteNodeMap();
  GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

  if (GenApi::IsWritable(p))
  {
    p->SetValue(1);
  }

  // determine maximum buffer size from transport layer or remote device

  size_t size=0;
  if (getDefinesPayloadsize())
  {
    size=getPayloadSize();
  }
  else
  {
    GenApi::IInteger *pp=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("PayloadSize"));

    if (GenApi::IsReadable(pp))
    {
      size=static_cast<size_t>(pp->GetValue());
    }
  }

  // announce and queue the minimum number of buffers

  bool err=false;

  bn=std::max(static_cast<size_t>(min_buffers), getBufAnnounceMin());
  for (size_t i=0; i<bn; i++)
  {
    GenTL::BUFFER_HANDLE pp=0;

    if (gentl->DSAllocAndAnnounceBuffer(stream, size, 0, &pp) != GenTL::GC_ERR_SUCCESS)
    {
      err=true;
      break;
    }

    if (!err && gentl->DSQueueBuffer(stream, pp) != GenTL::GC_ERR_SUCCESS)
    {
      err=true;
      break;
    }
  }

  // register event

  if (!err && gentl->GCRegisterEvent(stream, GenTL::EVENT_NEW_BUFFER, &event) !=
      GenTL::GC_ERR_SUCCESS)
  {
    err=true;
  }

  // start streaming

  uint64_t n=GENTL_INFINITE;

  if (nacquire > 0)
  {
    n=static_cast<uint64_t>(nacquire);
  }

  if (!err && gentl->DSStartAcquisition(stream, GenTL::ACQ_START_FLAGS_DEFAULT, n) !=
      GenTL::GC_ERR_SUCCESS)
  {
    gentl->GCUnregisterEvent(stream, GenTL::EVENT_NEW_BUFFER);
    err=true;
  }

  if (!err)
  {
    GenApi::CCommandPtr start=parent->getRemoteNodeMap()->_GetNode("AcquisitionStart");
    start->Execute();
  }

  // revoke buffers in case of an error, before throwing an event

  if (err)
  {
    gentl->DSFlushQueue(stream, GenTL::ACQ_QUEUE_ALL_DISCARD);

    GenTL::BUFFER_HANDLE pp=0;
    while (gentl->DSGetBufferID(stream, 0, &pp) == GenTL::GC_ERR_SUCCESS)
    {
      gentl->DSRevokeBuffer(stream, pp, 0, 0);
    }

    // unlock parameters

    GenApi::IInteger *pi=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

    if (GenApi::IsWritable(pi))
    {
      pi->SetValue(0);
    }

    throw GenTLException("Stream::startStreaming()", gentl);
  }
}